

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLTEXTURESTORAGE2DMULTISAMPLEPROC epoxy_glTextureStorage2DMultisample_resolver(void)

{
  PFNGLTEXTURESTORAGE2DMULTISAMPLEPROC p_Var1;
  
  p_Var1 = (PFNGLTEXTURESTORAGE2DMULTISAMPLEPROC)
           gl_provider_resolver
                     ("glTextureStorage2DMultisample",
                      epoxy_glTextureStorage2DMultisample_resolver::providers,
                      epoxy_glTextureStorage2DMultisample_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLTEXTURESTORAGE2DMULTISAMPLEPROC
epoxy_glTextureStorage2DMultisample_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_4_5,
        GL_extension_GL_ARB_direct_state_access,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        52768 /* "glTextureStorage2DMultisample" */,
        52768 /* "glTextureStorage2DMultisample" */,
    };
    return gl_provider_resolver(entrypoint_strings + 52768 /* "glTextureStorage2DMultisample" */,
                                providers, entrypoints);
}